

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_create(REF_GEOM *ref_geom_ptr)

{
  REF_GEOM pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GEOM ref_geom;
  REF_GEOM *ref_geom_ptr_local;
  
  *ref_geom_ptr = (REF_GEOM)0x0;
  pRVar1 = (REF_GEOM)malloc(0xf0);
  *ref_geom_ptr = pRVar1;
  if (*ref_geom_ptr == (REF_GEOM)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x40,
           "ref_geom_create","malloc *ref_geom_ptr of REF_GEOM_STRUCT NULL");
    ref_geom_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_geom_ptr;
    pRVar1->max = 10;
    if (pRVar1->max * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x47,
             "ref_geom_create","malloc ref_geom->descr of REF_INT negative");
      ref_geom_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)(pRVar1->max * 6) << 2);
      pRVar1->descr = pRVar2;
      if (pRVar1->descr == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x47
               ,"ref_geom_create","malloc ref_geom->descr of REF_INT NULL");
        ref_geom_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->max * 2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x48
               ,"ref_geom_create","malloc ref_geom->param of REF_DBL negative");
        ref_geom_ptr_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_DBL *)malloc((long)(pRVar1->max << 1) << 3);
        pRVar1->param = pRVar3;
        if (pRVar1->param == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x48,"ref_geom_create","malloc ref_geom->param of REF_DBL NULL");
          ref_geom_ptr_local._4_4_ = 2;
        }
        else {
          pRVar1->ref_adj = (REF_ADJ)0x0;
          ref_geom_ptr_local._4_4_ = ref_geom_initialize(pRVar1);
          if (ref_geom_ptr_local._4_4_ == 0) {
            pRVar1->uv_area_sign = (REF_DBL *)0x0;
            pRVar1->initial_cell_height = (REF_DBL *)0x0;
            pRVar1->face_min_length = (REF_DBL *)0x0;
            pRVar1->face_seg_per_rad = (REF_DBL *)0x0;
            pRVar1->segments_per_radian_of_curvature = 2.0;
            pRVar1->segments_per_bounding_box_diagonal = 10.0;
            pRVar1->tolerance_protection = 100.0;
            pRVar1->gap_protection = 10.0;
            pRVar1->nnode = -1;
            pRVar1->nedge = -1;
            pRVar1->nface = -1;
            pRVar1->zip_pcurve = 0;
            pRVar1->effective = 0;
            pRVar1->effective_curvature = 1;
            pRVar1->manifold = 1;
            pRVar1->contex_owned = 1;
            pRVar1->context = (void *)0x0;
            ref_geom_ptr_local._4_4_ = ref_egads_open(pRVar1);
            if (ref_geom_ptr_local._4_4_ == 0) {
              pRVar1->model = (void *)0x0;
              pRVar1->body = (void *)0x0;
              pRVar1->faces = (void *)0x0;
              pRVar1->edges = (void *)0x0;
              pRVar1->nodes = (void *)0x0;
              pRVar1->pcurves = (void **)0x0;
              pRVar1->e2f = (REF_INT *)0x0;
              pRVar1->cad_data_size = 0;
              pRVar1->cad_data = (REF_BYTE *)0x0;
              pRVar1->meshlink = (void *)0x0;
              pRVar1->meshlink_projection = (void *)0x0;
              pRVar1->ref_facelift = (REF_FACELIFT)0x0;
              ref_geom_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x5e,"ref_geom_create",(ulong)ref_geom_ptr_local._4_4_,"open egads");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x4a,"ref_geom_create",(ulong)ref_geom_ptr_local._4_4_,"init geom list");
          }
        }
      }
    }
  }
  return ref_geom_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_create(REF_GEOM *ref_geom_ptr) {
  REF_GEOM ref_geom;

  (*ref_geom_ptr) = NULL;

  ref_malloc(*ref_geom_ptr, 1, REF_GEOM_STRUCT);

  ref_geom = (*ref_geom_ptr);

  ref_geom_max(ref_geom) = 10;

  ref_malloc(ref_geom->descr, REF_GEOM_DESCR_SIZE * ref_geom_max(ref_geom),
             REF_INT);
  ref_malloc(ref_geom->param, 2 * ref_geom_max(ref_geom), REF_DBL);
  ref_geom->ref_adj = (REF_ADJ)NULL;
  RSS(ref_geom_initialize(ref_geom), "init geom list");

  ref_geom->uv_area_sign = NULL;
  ref_geom->initial_cell_height = NULL;
  ref_geom->face_min_length = NULL;
  ref_geom->face_seg_per_rad = NULL;
  ref_geom->segments_per_radian_of_curvature = 2.0;
  ref_geom->segments_per_bounding_box_diagonal = 10.0;
  ref_geom->tolerance_protection = 100.0;
  ref_geom->gap_protection = 10.0;

  ref_geom->nnode = REF_EMPTY;
  ref_geom->nedge = REF_EMPTY;
  ref_geom->nface = REF_EMPTY;
  ref_geom->zip_pcurve = REF_FALSE;
  ref_geom->effective = REF_FALSE;
  ref_geom->effective_curvature = REF_TRUE;
  ref_geom->manifold = REF_TRUE;
  ref_geom->contex_owned = REF_TRUE;
  ref_geom->context = NULL;
  RSS(ref_egads_open(ref_geom), "open egads");
  ref_geom->model = NULL;
  ref_geom->body = NULL;
  ref_geom->faces = NULL;
  ref_geom->edges = NULL;
  ref_geom->nodes = NULL;
  ref_geom->pcurves = NULL;
  ref_geom->e2f = NULL;

  ref_geom->cad_data_size = 0;
  ref_geom->cad_data = (REF_BYTE *)NULL;

  ref_geom->meshlink = NULL;
  ref_geom->meshlink_projection = NULL;

  ref_geom->ref_facelift = NULL;

  return REF_SUCCESS;
}